

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_cfg.cpp
# Opt level: O3

bool __thiscall mocker::RemoveUnreachableBlocks::operator()(RemoveUnreachableBlocks *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  size_t sVar3;
  BasicBlock *bb;
  __hash_code __code;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  FunctionModule *pFVar6;
  unsigned_long *succ;
  _List_node_base *p_Var7;
  iterator __j;
  _List_node_base *p_Var8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  reachable;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> local_a0;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x18);
  *(_Any_data **)local_88._M_unused._0_8_ = &local_88;
  *(_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    **)((long)local_88._M_unused._0_8_ + 8) = &local_68;
  *(RemoveUnreachableBlocks **)((long)local_88._M_unused._0_8_ + 0x10) = this;
  local_70 = std::
             _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/simplify_cfg.cpp:116:48)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/simplify_cfg.cpp:116:48)>
             ::_M_manager;
  local_a0._M_impl._M_node.super__List_node_base._M_next =
       (((this->super_FuncPass).func)->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next[1]._M_next;
  std::
  _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/simplify_cfg.cpp:116:48)>
  ::_M_invoke(&local_88,(unsigned_long *)&local_a0);
  pFVar6 = (this->super_FuncPass).func;
  p_Var8 = (pFVar6->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)&pFVar6->bbs) {
    do {
      uVar4 = (ulong)p_Var8[1]._M_next % local_68._M_bucket_count;
      if (local_68._M_buckets[uVar4] != (__node_base_ptr)0x0) {
        p_Var5 = local_68._M_buckets[uVar4]->_M_nxt;
        p_Var7 = (_List_node_base *)p_Var5[1]._M_nxt;
        do {
          if (p_Var8[1]._M_next == p_Var7) goto LAB_0017263e;
          p_Var5 = p_Var5->_M_nxt;
        } while ((p_Var5 != (_Hash_node_base *)0x0) &&
                (p_Var7 = (_List_node_base *)p_Var5[1]._M_nxt,
                (ulong)p_Var7 % local_68._M_bucket_count == uVar4));
      }
      ir::BasicBlock::getSuccessors
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,
                 (BasicBlock *)(p_Var8 + 1));
      p_Var2 = local_a0._M_impl._M_node.super__List_node_base._M_prev;
      for (p_Var7 = local_a0._M_impl._M_node.super__List_node_base._M_next; p_Var7 != p_Var2;
          p_Var7 = (_List_node_base *)&p_Var7->_M_prev) {
        bb = ir::FunctionModule::getMutableBasicBlock
                       ((this->super_FuncPass).func,(size_t)p_Var7->_M_next);
        deletePhiOptionInBB(bb,((BasicBlock *)(p_Var8 + 1))->labelID);
      }
      if (local_a0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
        operator_delete(local_a0._M_impl._M_node.super__List_node_base._M_next,
                        local_a0._M_impl._M_node._M_size -
                        (long)local_a0._M_impl._M_node.super__List_node_base._M_next);
      }
LAB_0017263e:
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)&pFVar6->bbs);
    pFVar6 = (this->super_FuncPass).func;
    p_Var8 = (pFVar6->bbs).
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  }
  this->cnt = (pFVar6->bbs).
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
              _M_impl._M_node._M_size - local_68._M_element_count;
  local_a0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a0;
  local_a0._M_impl._M_node._M_size = 0;
  local_a0._M_impl._M_node.super__List_node_base._M_prev =
       local_a0._M_impl._M_node.super__List_node_base._M_next;
  do {
    do {
      while( true ) {
        p_Var7 = p_Var8;
        if (p_Var7 == (_List_node_base *)&pFVar6->bbs) {
          std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
          ::_M_clear(&local_a0);
          sVar3 = this->cnt;
          if (local_78 != (code *)0x0) {
            (*local_78)(&local_88,&local_88,3);
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_68);
          return sVar3 != 0;
        }
        p_Var8 = p_Var7->_M_next;
        p_Var2 = p_Var7[1]._M_next;
        if (local_68._M_buckets[(ulong)p_Var2 % local_68._M_bucket_count] != (__node_base_ptr)0x0)
        break;
LAB_001726d4:
        if (p_Var8 != local_a0._M_impl._M_node.super__List_node_base._M_next &&
            local_a0._M_impl._M_node.super__List_node_base._M_next != p_Var7) {
          std::__detail::_List_node_base::_M_transfer
                    (local_a0._M_impl._M_node.super__List_node_base._M_next,p_Var7);
          local_a0._M_impl._M_node._M_size = local_a0._M_impl._M_node._M_size + 1;
          psVar1 = &(pFVar6->bbs).
                    super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 - 1;
        }
      }
      p_Var5 = local_68._M_buckets[(ulong)p_Var2 % local_68._M_bucket_count]->_M_nxt;
    } while (p_Var2 == (_List_node_base *)p_Var5[1]._M_nxt);
    do {
      p_Var5 = p_Var5->_M_nxt;
      if ((p_Var5 == (_Hash_node_base *)0x0) ||
         ((ulong)p_Var5[1]._M_nxt % local_68._M_bucket_count !=
          (ulong)p_Var2 % local_68._M_bucket_count)) goto LAB_001726d4;
    } while (p_Var2 != (_List_node_base *)p_Var5[1]._M_nxt);
  } while( true );
}

Assistant:

bool RemoveUnreachableBlocks::operator()() {
  std::unordered_set<std::size_t> reachable;
  std::function<void(std::size_t cur)> visit = [&visit, &reachable,
                                                this](std::size_t cur) {
    if (reachable.find(cur) != reachable.end())
      return;
    reachable.emplace(cur);
    for (auto suc : func.getBasicBlock(cur).getSuccessors())
      visit(suc);
  };
  visit(func.getFirstBB()->getLabelID());

  for (auto &bb : func.getBBs()) {
    if (reachable.find(bb.getLabelID()) != reachable.end())
      continue;
    for (auto &succ : bb.getSuccessors()) {
      deletePhiOptionInBB(func.getMutableBasicBlock(succ), bb.getLabelID());
    }
  }

  cnt = func.getBBs().size() - reachable.size();
  func.getMutableBBs().remove_if([&reachable](const ir::BasicBlock &bb) {
    return reachable.find(bb.getLabelID()) == reachable.end();
  });
  return cnt != 0;
}